

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

optional<Vault::AuthenticationResponse> * __thiscall
SuccessfulAuth::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,SuccessfulAuth *this,
          Client *client)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  uint *local_a0;
  undefined8 local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  size_type *local_80;
  undefined8 local_78;
  size_type local_70;
  undefined8 uStack_68;
  size_type *local_60;
  size_type local_58;
  undefined1 local_50;
  uint7 uStack_4f;
  undefined8 uStack_48;
  uint *local_40;
  size_type local_38;
  uint local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  local_40 = &local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  sVar2 = local_38;
  if (local_40 == &local_30) {
    uStack_88 = uStack_28;
    uStack_84 = uStack_24;
    local_a0 = (uint *)&local_90;
  }
  else {
    local_a0 = local_40;
  }
  local_90 = CONCAT44(uStack_2c,local_30);
  local_38 = 0;
  local_30 = local_30 & 0xffffff00;
  local_60 = (size_type *)&local_50;
  local_40 = &local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"success","");
  if (local_60 == (size_type *)&local_50) {
    uStack_68 = uStack_48;
    local_80 = &local_70;
  }
  else {
    local_80 = local_60;
  }
  local_70 = CONCAT71(uStack_4f,local_50);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&(__return_storage_ptr__->
                      super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
                      super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
                      super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload.
                      _M_value.rawResponse.value_ + 0x10);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&(__return_storage_ptr__->super__Optional_base<Vault::AuthenticationResponse,_false,_false>).
        _M_payload.super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
        super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload = paVar1;
  if (local_a0 == (uint *)&local_90) {
    paVar1->_M_allocated_capacity = local_90;
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
                      super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
                      super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload.
                      _M_value.rawResponse.value_ + 0x18) = CONCAT44(uStack_84,uStack_88);
  }
  else {
    *(uint **)&(__return_storage_ptr__->
               super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
               super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
               super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload = local_a0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)&(__return_storage_ptr__->
                super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
                super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
                super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.
                rawResponse.value_ + 0x10))->_M_allocated_capacity = local_90;
  }
  *(size_type *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
           super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
           super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.
           rawResponse.value_ + 8) = sVar2;
  local_90 = local_90 & 0xffffffffffffff00;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&(__return_storage_ptr__->
                      super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
                      super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
                      super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload.
                      _M_value.token.value_ + 0x10);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)((long)&(__return_storage_ptr__->
               super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
               super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
               super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload + 0x20) =
       paVar1;
  if (local_80 == &local_70) {
    paVar1->_M_allocated_capacity = local_70;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
             super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
             super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.token.
             value_ + 0x18) = uStack_68;
  }
  else {
    (__return_storage_ptr__->super__Optional_base<Vault::AuthenticationResponse,_false,_false>).
    _M_payload.super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
    super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.token.value_.
    _M_dataplus = (_Alloc_hider)local_80;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)&(__return_storage_ptr__->
                super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
                super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
                super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.
                token.value_ + 0x10))->_M_allocated_capacity = local_70;
  }
  *(size_type *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
           super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
           super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.token.
           value_ + 8) = local_58;
  local_70 = (ulong)uStack_4f << 8;
  (__return_storage_ptr__->super__Optional_base<Vault::AuthenticationResponse,_false,_false>).
  _M_payload.super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
  super__Optional_payload_base<Vault::AuthenticationResponse>._M_engaged = true;
  local_50 = 0;
  local_58 = 0;
  local_78 = 0;
  if (local_40 != &local_30) {
    local_80 = &local_70;
    local_60 = (size_type *)&local_50;
    operator_delete(local_40,CONCAT44(uStack_2c,local_30) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
  authenticate(const Vault::Client &client) override {
    return std::optional<Vault::AuthenticationResponse>(
        {Vault::HttpResponseBodyString{""}, Vault::Token{"success"}});
  }